

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O3

void __thiscall
TEST_DoublingFactorCounterTest_BigThreeDragons_TestShell::
~TEST_DoublingFactorCounterTest_BigThreeDragons_TestShell
          (TEST_DoublingFactorCounterTest_BigThreeDragons_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, BigThreeDragons)
{
	addPair(Tile::WestWind);
	addTriplet(Tile::WhiteDragon, true);
	addTriplet(Tile::RedDragon, false);
	addTriplet(Tile::GreenDragon, false);
	addSequence(Tile::TwoOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::BigThreeDragons));
	CHECK_EQUAL(0, r.patterns.count(Pattern::WhiteDragon));
	CHECK_EQUAL(0, r.patterns.count(Pattern::RedDragon));
	CHECK_EQUAL(0, r.patterns.count(Pattern::GreenDragon));
	CHECK_EQUAL(100, r.doubling_factor);
}